

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFrames(Abc_Ntk_t *pNtk,int nFrames,int fInitial,int fVerbose)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  Abc_Ntk_t *pNtk_00;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  ProgressBar *p;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  long lVar11;
  char Buffer [1000];
  char local_422 [10];
  char local_418 [1000];
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x30e,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x30f,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  iVar5 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar5 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x310,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  if (pNtk->nObjCounts[8] != pNtk->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x311,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  sprintf(local_418,"%s_%d_frames",pNtk->pName,(ulong)(uint)nFrames);
  pcVar6 = Extra_UtilStrsav(local_418);
  pNtk_00->pName = pcVar6;
  pAVar7 = Abc_AigConst1(pNtk_00);
  pAVar8 = Abc_AigConst1(pNtk);
  (pAVar8->field_6).pCopy = pAVar7;
  pVVar9 = pNtk->vBoxes;
  if (fInitial == 0) {
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar9->pArray[lVar11])->field_0x14 & 0xf) == 8) {
          Abc_NtkDupBox(pNtk_00,(Abc_Obj_t *)pVVar9->pArray[lVar11],1);
          pVVar9 = pNtk->vBoxes;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar9->nSize);
    }
  }
  else if (0 < pVVar9->nSize) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      plVar1 = (long *)pVVar9->pArray[lVar11];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
        if ((plVar1[7] == 3) || (plVar1[7] == 0)) {
          pAVar8 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
          (pAVar7->field_6).pCopy = pAVar8;
          pcVar6 = Abc_ObjName(pAVar7);
          Abc_ObjAssignName(pAVar8,pcVar6,(char *)0x0);
          uVar10 = uVar10 + 1;
        }
        else {
          pAVar8 = Abc_AigConst1(pNtk_00);
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                          ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
          }
          (pAVar7->field_6).pTemp = (void *)((ulong)(plVar1[7] == 1) ^ (ulong)pAVar8);
        }
      }
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vBoxes;
    } while (lVar11 < pVVar9->nSize);
    if (uVar10 != 0) {
      printf("Warning: %d uninitialized latches are replaced by free PI variables.\n",(ulong)uVar10)
      ;
    }
  }
  p = Extra_ProgressBarStart(_stdout,nFrames);
  uVar10 = 0;
  do {
    if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= (int)uVar10)) {
      Extra_ProgressBarUpdate_int(p,uVar10,(char *)0x0);
    }
    sprintf(local_422,"_%02d",(ulong)uVar10);
    pVVar9 = pNtk->vPis;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        pAVar7 = (Abc_Obj_t *)pVVar9->pArray[lVar11];
        pAVar8 = Abc_NtkDupObj(pNtk_00,pAVar7,0);
        pcVar6 = Abc_ObjName(pAVar7);
        Abc_ObjAssignName(pAVar8,pcVar6,local_422);
        lVar11 = lVar11 + 1;
        pVVar9 = pNtk->vPis;
      } while (lVar11 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vObjs;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        puVar2 = (undefined8 *)pVVar9->pArray[lVar11];
        if (puVar2 != (undefined8 *)0x0) {
          if (((ulong)puVar2 & 1) != 0) {
            pcVar6 = "!Abc_ObjIsComplement(pNode)";
LAB_002d88cb:
            __assert_fail(pcVar6,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                          ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
          }
          if (*(int *)*puVar2 != 3) {
            pcVar6 = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_002d88cb;
          }
          if (*(int *)((long)puVar2 + 0x1c) == 2) {
            lVar3 = *(long *)(*(long *)((int *)*puVar2 + 8) + 8);
            pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                                (Abc_Obj_t *)
                                ((ulong)(*(uint *)((long)puVar2 + 0x14) >> 10 & 1) ^
                                *(ulong *)(*(long *)(lVar3 + (long)*(int *)puVar2[4] * 8) + 0x40)),
                                (Abc_Obj_t *)
                                ((ulong)(*(uint *)((long)puVar2 + 0x14) >> 0xb & 1) ^
                                *(ulong *)(*(long *)(lVar3 + (long)((int *)puVar2[4])[1] * 8) + 0x40
                                          )));
            puVar2[8] = pAVar7;
            pVVar9 = pNtk->vObjs;
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vPos;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        pAVar7 = (Abc_Obj_t *)pVVar9->pArray[lVar11];
        pAVar8 = Abc_NtkDupObj(pNtk_00,pAVar7,0);
        pcVar6 = Abc_ObjName(pAVar7);
        Abc_ObjAssignName(pAVar8,pcVar6,local_422);
        Abc_ObjAddFanin((pAVar7->field_6).pCopy,
                        (Abc_Obj_t *)
                        ((ulong)(*(uint *)&pAVar7->field_0x14 >> 10 & 1) ^
                        *(ulong *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] +
                                  0x40)));
        lVar11 = lVar11 + 1;
        pVVar9 = pNtk->vPos;
      } while (lVar11 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vBoxes;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        plVar1 = (long *)pVVar9->pArray[lVar11];
        if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
          plVar4 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8
                             );
          plVar1[8] = (ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                      *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                          (long)*(int *)plVar4[4] * 8) + 0x40);
          pVVar9 = pNtk->vBoxes;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar9->nSize);
      if (0 < pVVar9->nSize) {
        lVar11 = 0;
        do {
          plVar1 = (long *)pVVar9->pArray[lVar11];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            *(long *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8) + 0x40) = plVar1[8];
            pVVar9 = pNtk->vBoxes;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar9->nSize);
      }
    }
    uVar10 = uVar10 + 1;
    if (uVar10 == nFrames) {
      Extra_ProgressBarStop(p);
      if ((fInitial == 0) && (pVVar9 = pNtk->vBoxes, 0 < pVVar9->nSize)) {
        lVar11 = 0;
        do {
          plVar1 = (long *)pVVar9->pArray[lVar11];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            lVar3 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
            Abc_ObjAddFanin(*(Abc_Obj_t **)(*(long *)(lVar3 + (long)*(int *)plVar1[4] * 8) + 0x40),
                            *(Abc_Obj_t **)(*(long *)(lVar3 + (long)*(int *)plVar1[6] * 8) + 0x40));
            pVVar9 = pNtk->vBoxes;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar9->nSize);
      }
      Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
      Abc_NtkOrderCisCos(pNtk_00);
      iVar5 = Abc_NtkCheck(pNtk_00);
      if (iVar5 == 0) {
        puts("Abc_NtkFrames: The network check has failed.");
        Abc_NtkDelete(pNtk_00);
        pNtk_00 = (Abc_Ntk_t *)0x0;
      }
      return pNtk_00;
    }
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkFrames( Abc_Ntk_t * pNtk, int nFrames, int fInitial, int fVerbose )
{
    char Buffer[1000];
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkFrames;
    Abc_Obj_t * pLatch, * pLatchOut;
    int i, Counter;
    assert( nFrames > 0 );
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );
    // start the new network
    pNtkFrames = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_%d_frames", pNtk->pName, nFrames );
    pNtkFrames->pName = Extra_UtilStrsav(Buffer);
    // map the constant nodes
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkFrames);
    // create new latches (or their initial values) and remember them in the new latches
    if ( !fInitial )
    {
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Abc_NtkDupBox( pNtkFrames, pLatch, 1 );
    }
    else
    {
        Counter = 0;
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            pLatchOut = Abc_ObjFanout0(pLatch);
            if ( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) ) // don't-care initial value - create a new PI
            {
                pLatchOut->pCopy = Abc_NtkCreatePi(pNtkFrames);
                Abc_ObjAssignName( pLatchOut->pCopy, Abc_ObjName(pLatchOut), NULL );
                Counter++;
            }
            else
                pLatchOut->pCopy = Abc_ObjNotCond( Abc_AigConst1(pNtkFrames), Abc_LatchIsInit0(pLatch) );
        }
        if ( Counter )
            printf( "Warning: %d uninitialized latches are replaced by free PI variables.\n", Counter );
    }
    
    // create the timeframes
    pProgress = Extra_ProgressBarStart( stdout, nFrames );
    for ( i = 0; i < nFrames; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Abc_NtkAddFrame( pNtkFrames, pNtk, i );
    }
    Extra_ProgressBarStop( pProgress );
    
    // connect the new latches to the outputs of the last frame
    if ( !fInitial )
    {
        // we cannot use pLatch->pCopy here because pLatch->pCopy is used for temporary storage of strashed values
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Abc_ObjAddFanin( Abc_ObjFanin0(pLatch)->pCopy, Abc_ObjFanout0(pLatch)->pCopy );
    }

    // remove dangling nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtkFrames->pManFunc );
    // reorder the latches
    Abc_NtkOrderCisCos( pNtkFrames );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkFrames ) )
    {
        printf( "Abc_NtkFrames: The network check has failed.\n" );
        Abc_NtkDelete( pNtkFrames );
        return NULL;
    }
    return pNtkFrames;
}